

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O0

void lj_trace_initstate(global_State *g)

{
  undefined8 *puVar1;
  TValue *tv;
  jit_State *J;
  global_State *g_local;
  
  puVar1 = (undefined8 *)((ulong)((long)&g[1].registrytv + 7U) & 0xfffffffffffffff0);
  *puVar1 = 0x7fffffffffffffff;
  puVar1[1] = 0x7fffffffffffffff;
  puVar1 = (undefined8 *)((ulong)&g[1].uvhead.field_0xf & 0xfffffffffffffff0);
  *puVar1 = 0x8000000000000000;
  puVar1[1] = 0x8000000000000000;
  g[1].uvhead.field_5.field_1.next.gcptr64 = 0x4338000000000000;
  g[1].uvhead.v.ptr64 = 0x43f0000000000000;
  g[1].nilnode.key.field_4.it = 0xdf800000;
  *(undefined8 *)&g[1].uvhead.dhash = 0xc3f0000000000000;
  return;
}

Assistant:

void lj_trace_initstate(global_State *g)
{
  jit_State *J = G2J(g);
  TValue *tv;

  /* Initialize aligned SIMD constants. */
  tv = LJ_KSIMD(J, LJ_KSIMD_ABS);
  tv[0].u64 = U64x(7fffffff,ffffffff);
  tv[1].u64 = U64x(7fffffff,ffffffff);
  tv = LJ_KSIMD(J, LJ_KSIMD_NEG);
  tv[0].u64 = U64x(80000000,00000000);
  tv[1].u64 = U64x(80000000,00000000);

  /* Initialize 32/64 bit constants. */
#if LJ_TARGET_X86ORX64
  J->k64[LJ_K64_TOBIT].u64 = U64x(43380000,00000000);
#if LJ_32
  J->k64[LJ_K64_M2P64_31].u64 = U64x(c1e00000,00000000);
#endif
  J->k64[LJ_K64_2P64].u64 = U64x(43f00000,00000000);
  J->k32[LJ_K32_M2P64_31] = LJ_64 ? 0xdf800000 : 0xcf000000;
#endif
#if LJ_TARGET_X86ORX64 || LJ_TARGET_MIPS64
  J->k64[LJ_K64_M2P64].u64 = U64x(c3f00000,00000000);
#endif
#if LJ_TARGET_PPC
  J->k32[LJ_K32_2P52_2P31] = 0x59800004;
  J->k32[LJ_K32_2P52] = 0x59800000;
#endif
#if LJ_TARGET_PPC || LJ_TARGET_MIPS
  J->k32[LJ_K32_2P31] = 0x4f000000;
#endif
#if LJ_TARGET_MIPS
  J->k64[LJ_K64_2P31].u64 = U64x(41e00000,00000000);
#if LJ_64
  J->k64[LJ_K64_2P63].u64 = U64x(43e00000,00000000);
  J->k32[LJ_K32_2P63] = 0x5f000000;
  J->k32[LJ_K32_M2P64] = 0xdf800000;
#endif
#endif
}